

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

SRes LzmaDec_Allocate(CLzmaDec *p,Byte *props,uint propsSize,ISzAllocPtr alloc)

{
  CLzmaProps CVar1;
  Byte *pBVar2;
  ulong local_58;
  SizeT mask;
  UInt32 dictSize;
  int _result__1;
  int _result_;
  SizeT dicBufSize;
  CLzmaProps propNew;
  ISzAllocPtr alloc_local;
  uint propsSize_local;
  Byte *props_local;
  CLzmaDec *p_local;
  
  propNew = (CLzmaProps)alloc;
  p_local._4_4_ = LzmaProps_Decode((CLzmaProps *)&dicBufSize,props,propsSize);
  if ((p_local._4_4_ == 0) &&
     (p_local._4_4_ = LzmaDec_AllocateProbs2(p,(CLzmaProps *)&dicBufSize,(ISzAllocPtr)propNew),
     p_local._4_4_ == 0)) {
    local_58 = 0xfff;
    if (dicBufSize._4_4_ < 0x40000000) {
      if (0x3fffff < dicBufSize._4_4_) {
        local_58 = 0xfffff;
      }
    }
    else {
      local_58 = 0x3fffff;
    }
    __result__1 = dicBufSize._4_4_ + local_58 & (local_58 ^ 0xffffffffffffffff);
    if (__result__1 < dicBufSize._4_4_) {
      __result__1 = (ulong)dicBufSize._4_4_;
    }
    if ((p->dic == (Byte *)0x0) || (__result__1 != p->dicBufSize)) {
      LzmaDec_FreeDict(p,(ISzAllocPtr)propNew);
      pBVar2 = (Byte *)(**(code **)propNew)(propNew,__result__1);
      p->dic = pBVar2;
      if (p->dic == (Byte *)0x0) {
        LzmaDec_FreeProbs(p,(ISzAllocPtr)propNew);
        return 2;
      }
    }
    p->dicBufSize = __result__1;
    CVar1.dicSize = dicBufSize._4_4_;
    CVar1.lc = (undefined1)dicBufSize;
    CVar1.lp = dicBufSize._1_1_;
    CVar1.pb = dicBufSize._2_1_;
    CVar1._pad_ = dicBufSize._3_1_;
    p->prop = CVar1;
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

SRes LzmaDec_Allocate(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAllocPtr alloc)
{
  CLzmaProps propNew;
  SizeT dicBufSize;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize))
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc))

  {
    UInt32 dictSize = propNew.dicSize;
    SizeT mask = ((UInt32)1 << 12) - 1;
         if (dictSize >= ((UInt32)1 << 30)) mask = ((UInt32)1 << 22) - 1;
    else if (dictSize >= ((UInt32)1 << 22)) mask = ((UInt32)1 << 20) - 1;
    dicBufSize = ((SizeT)dictSize + mask) & ~mask;
    if (dicBufSize < dictSize)
      dicBufSize = dictSize;
  }

  if (!p->dic || dicBufSize != p->dicBufSize)
  {
    LzmaDec_FreeDict(p, alloc);
    p->dic = (Byte *)ISzAlloc_Alloc(alloc, dicBufSize);
    if (!p->dic)
    {
      LzmaDec_FreeProbs(p, alloc);
      return SZ_ERROR_MEM;
    }
  }
  p->dicBufSize = dicBufSize;
  p->prop = propNew;
  return SZ_OK;
}